

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

void __thiscall Assembler::processWordHelper(Assembler *this,int value)

{
  mapped_type *pmVar1;
  value_type local_16;
  value_type local_15;
  int local_14;
  char lB;
  char hB;
  Assembler *pAStack_10;
  int value_local;
  Assembler *this_local;
  
  local_15 = (value_type)((uint)value >> 8);
  local_16 = (value_type)value;
  local_14 = value;
  pAStack_10 = this;
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
           ::operator[](&this->codeBySection,&currentSectionName_abi_cxx11_);
  std::vector<char,_std::allocator<char>_>::push_back(pmVar1,&local_16);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
           ::operator[](&this->codeBySection,&currentSectionName_abi_cxx11_);
  std::vector<char,_std::allocator<char>_>::push_back(pmVar1,&local_15);
  return;
}

Assistant:

void Assembler::processWordHelper(int value) {


    char hB = (((unsigned) value) >> 8) & 0xFF;
    char lB = ((unsigned) value) & 0xFF;

    codeBySection[currentSectionName].push_back(lB);
    codeBySection[currentSectionName].push_back(hB);
    return;

}